

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

bool __thiscall Player::travel(Player *this,string *direction)

{
  bool bVar1;
  mapped_type *pmVar2;
  pointer pRVar3;
  mapped_type *pmVar4;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_30;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_28;
  string *local_20;
  string *direction_local;
  Player *this_local;
  
  local_20 = direction;
  direction_local = (string *)this;
  pmVar2 = std::
           unordered_map<int,_std::unique_ptr<Room,_std::default_delete<Room>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>_>
           ::at(&(this->map).rooms,&this->currentLocation);
  pRVar3 = std::unique_ptr<Room,_std::default_delete<Room>_>::operator->(pmVar2);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&pRVar3->exits,direction);
  pmVar2 = std::
           unordered_map<int,_std::unique_ptr<Room,_std::default_delete<Room>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>_>
           ::at(&(this->map).rooms,&this->currentLocation);
  pRVar3 = std::unique_ptr<Room,_std::default_delete<Room>_>::operator->(pmVar2);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&pRVar3->exits);
  bVar1 = std::__detail::operator==(&local_28,&local_30);
  if (!bVar1) {
    pmVar2 = std::
             unordered_map<int,_std::unique_ptr<Room,_std::default_delete<Room>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<Room,_std::default_delete<Room>_>_>_>_>
             ::at(&(this->map).rooms,&this->currentLocation);
    pRVar3 = std::unique_ptr<Room,_std::default_delete<Room>_>::operator->(pmVar2);
    pmVar4 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&pRVar3->exits,direction);
    this->currentLocation = *pmVar4;
    look(this);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool Player::travel(std::string direction)
{
  if (map.rooms.at(currentLocation)->exits.find(direction) == map.rooms.at(currentLocation)->exits.end())
    return false;
  currentLocation = map.rooms.at(currentLocation)->exits[direction];
  look();
  return true;
}